

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

void __thiscall UnifiedRegex::CountDomain::Print(CountDomain *this,DebugWriter *w)

{
  DebugWriter *w_local;
  CountDomain *this_local;
  
  if ((this->upper == 0xffffffff) || (this->lower != this->upper)) {
    DebugWriter::Print(w,L"[%u-",(ulong)this->lower);
    if (this->upper == 0xffffffff) {
      DebugWriter::Print(w,L"inf]");
    }
    else {
      DebugWriter::Print(w,L"%u]",(ulong)this->upper);
    }
  }
  else {
    DebugWriter::Print(w,L"[%u]",(ulong)this->lower);
  }
  return;
}

Assistant:

void CountDomain::Print(DebugWriter* w) const
    {
        if (upper != CharCountFlag && lower == (CharCount)upper)
        {
            w->Print(_u("[%u]"), lower);
        }
        else
        {
            w->Print(_u("[%u-"), lower);
            if (upper == CharCountFlag)
                w->Print(_u("inf]"));
            else
                w->Print(_u("%u]"), (CharCount)upper);
        }
    }